

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_growingReserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  uint32_t n_00;
  Error EVar1;
  
  if (this->_capacity < n) {
    n_00 = ZoneVector_growCapacity(this->_capacity,n,sizeOfT);
    EVar1 = _reserve(this,allocator,sizeOfT,n_00);
    return EVar1;
  }
  return 0;
}

Assistant:

Error ZoneVectorBase::_growingReserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t capacity = _capacity;
  if (capacity >= n)
    return kErrorOk;
  return _reserve(allocator, sizeOfT, ZoneVector_growCapacity(capacity, n, sizeOfT));
}